

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O3

int pem_write_bio_RSA_PUBKEY_i2d(void *x,uchar **outp)

{
  int iVar1;
  EVP_PKEY *pkey;
  
  if (x == (void *)0x0) {
    iVar1 = 0;
  }
  else {
    pkey = EVP_PKEY_new();
    if (pkey == (EVP_PKEY *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = EVP_PKEY_set1_RSA(pkey,(rsa_st *)x);
      if (iVar1 == 0) {
        iVar1 = -1;
      }
      else {
        iVar1 = i2d_PUBKEY(pkey,outp);
      }
      EVP_PKEY_free(pkey);
    }
  }
  return iVar1;
}

Assistant:

static DSA *pkey_get_dsa(EVP_PKEY *key, DSA **dsa) {
  DSA *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_DSA(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (dsa) {
    DSA_free(*dsa);
    *dsa = dtmp;
  }
  return dtmp;
}